

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void deqp::evalSubscriptMat4x2(ShaderEvalContext *c)

{
  undefined8 uVar1;
  undefined8 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  uVar1 = *(undefined8 *)(c->coords).m_data;
  uVar2 = *(undefined8 *)((c->coords).m_data + 2);
  fVar5 = (float)uVar2;
  fVar6 = (float)((ulong)uVar2 >> 0x20);
  fVar3 = (float)uVar1;
  fVar4 = (float)((ulong)uVar1 >> 0x20);
  *(ulong *)(c->color).m_data =
       CONCAT44(fVar3 * 0.125 + fVar6 * 0.25 + fVar5 * 0.5 + fVar4,
                fVar6 * 0.125 + fVar5 * 0.25 + fVar4 * 0.5 + fVar3);
  return;
}

Assistant:

Vector<T, 2>			swizzle		(int a, int b) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); return Vector<T, 2>(m_data[a], m_data[b]); }